

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O0

void __thiscall QLocalSocketPrivate::QLocalSocketPrivate(QLocalSocketPrivate *this)

{
  long lVar1;
  QIODevicePrivate *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffc8;
  SocketOption in_stack_ffffffffffffffcc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QIODevicePrivate::QIODevicePrivate(in_RDI,QObjectPrivateVersion);
  *(undefined ***)in_RDI = &PTR__QLocalSocketPrivate_004a01f8;
  QLocalUnixSocket::QLocalUnixSocket((QLocalUnixSocket *)in_RDI);
  *(undefined8 *)(in_RDI + 0x198) = 0;
  *(undefined8 *)(in_RDI + 0x1a0) = 0;
  QString::QString((QString *)0x386be1);
  *(undefined4 *)(in_RDI + 0x1c0) = 0xffffffff;
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags((QFlags<QIODeviceBase::OpenModeFlag> *)0x386bfc);
  *(undefined4 *)(in_RDI + 0x1c8) = 0;
  QString::QString((QString *)0x386c17);
  QString::QString((QString *)0x386c28);
  QFlags<QLocalSocket::SocketOption>::QFlags
            ((QFlags<QLocalSocket::SocketOption> *)in_RDI,in_stack_ffffffffffffffcc);
  QObjectBindableProperty<QLocalSocketPrivate,_QFlags<QLocalSocket::SocketOption>,_&QLocalSocketPrivate::_qt_property_socketOptions_offset,_nullptr>
  ::QObjectBindableProperty
            ((QObjectBindableProperty<QLocalSocketPrivate,_QFlags<QLocalSocket::SocketOption>,_&QLocalSocketPrivate::_qt_property_socketOptions_offset,_nullptr>
              *)in_RDI,
             (QFlags<QLocalSocket::SocketOption> *)
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QLocalSocketPrivate::QLocalSocketPrivate() : QIODevicePrivate(),
        delayConnect(nullptr),
        connectTimer(nullptr),
        connectingSocket(-1),
        state(QLocalSocket::UnconnectedState),
        socketOptions(QLocalSocket::NoOptions)
{
}